

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_decompress.c
# Opt level: O0

char get_next_file(int imageno,dircnt_t *dirptr,img_fol_t *img_fol,
                  opj_decompress_parameters *parameters)

{
  int iVar1;
  char *pcVar2;
  char local_5038 [8];
  char temp1 [4096];
  char *temp_p;
  char temp_ofname [4096];
  char outfilename [4096];
  char infilename [4096];
  char image_filename [4096];
  opj_decompress_parameters *parameters_local;
  img_fol_t *img_fol_local;
  dircnt_t *dirptr_local;
  int imageno_local;
  
  memset(local_5038,0,0x1000);
  strcpy(infilename + 0xff8,dirptr->filename[imageno]);
  fprintf(_stderr,"File Number %d \"%s\"\n",(ulong)(uint)imageno,infilename + 0xff8);
  sprintf(outfilename + 0xff8,"%s%s%s",img_fol->imgdirpath,path_separator,infilename + 0xff8);
  iVar1 = infile_format(outfilename + 0xff8);
  parameters->decod_format = iVar1;
  if (parameters->decod_format == -1) {
    dirptr_local._7_1_ = '\x01';
  }
  else {
    iVar1 = opj_strcpy_s(parameters->infile,0x1000,outfilename + 0xff8);
    if (iVar1 == 0) {
      pcVar2 = strtok(infilename + 0xff8,".");
      strcpy((char *)&temp_p,pcVar2);
      while (pcVar2 = strtok((char *)0x0,"."), pcVar2 != (char *)0x0) {
        strcat((char *)&temp_p,local_5038);
        sprintf(local_5038,".%s",pcVar2);
      }
      if (img_fol->set_out_format == '\x01') {
        sprintf(temp_ofname + 0xff8,"%s/%s.%s",img_fol->imgdirpath,&temp_p,img_fol->out_format);
        iVar1 = opj_strcpy_s(parameters->outfile,0x1000,temp_ofname + 0xff8);
        if (iVar1 != 0) {
          return '\x01';
        }
      }
      dirptr_local._7_1_ = '\0';
    }
    else {
      dirptr_local._7_1_ = '\x01';
    }
  }
  return dirptr_local._7_1_;
}

Assistant:

char get_next_file(int imageno, dircnt_t *dirptr, img_fol_t *img_fol,
                   opj_decompress_parameters *parameters)
{
    char image_filename[OPJ_PATH_LEN], infilename[OPJ_PATH_LEN],
         outfilename[OPJ_PATH_LEN], temp_ofname[OPJ_PATH_LEN];
    char *temp_p, temp1[OPJ_PATH_LEN] = "";

    strcpy(image_filename, dirptr->filename[imageno]);
    fprintf(stderr, "File Number %d \"%s\"\n", imageno, image_filename);
    sprintf(infilename, "%s%s%s", img_fol->imgdirpath, path_separator,
            image_filename);
    parameters->decod_format = infile_format(infilename);
    if (parameters->decod_format == -1) {
        return 1;
    }
    if (opj_strcpy_s(parameters->infile, sizeof(parameters->infile),
                     infilename) != 0) {
        return 1;
    }

    /*Set output file*/
    strcpy(temp_ofname, strtok(image_filename, "."));
    while ((temp_p = strtok(NULL, ".")) != NULL) {
        strcat(temp_ofname, temp1);
        sprintf(temp1, ".%s", temp_p);
    }
    if (img_fol->set_out_format == 1) {
        sprintf(outfilename, "%s/%s.%s", img_fol->imgdirpath, temp_ofname,
                img_fol->out_format);
        if (opj_strcpy_s(parameters->outfile, sizeof(parameters->outfile),
                         outfilename) != 0) {
            return 1;
        }
    }
    return 0;
}